

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rw_socket.cpp
# Opt level: O0

void __thiscall cppnet::RWSocket::Connect(RWSocket *this,string *ip,uint16_t port)

{
  bool bVar1;
  element_type *this_00;
  Event *pEVar2;
  SingletonLogger *this_01;
  unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
  *this_02;
  mapped_type *this_03;
  element_type *peVar3;
  AddressType at;
  SysCallInt64Result SVar4;
  enable_shared_from_this<cppnet::RWSocket> local_80;
  undefined1 local_70 [8];
  shared_ptr<cppnet::EventActions> actions;
  SysCallInt64Result ret;
  bool use_ipv4;
  enable_shared_from_this<cppnet::RWSocket> local_40;
  shared_ptr<cppnet::Socket> local_30;
  uint16_t local_1a;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_18;
  uint16_t port_local;
  string *ip_local;
  RWSocket *this_local;
  
  local_1a = port;
  _Stack_18._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ip;
  ip_local = (string *)this;
  if (this->_event == (Event *)0x0) {
    this_00 = std::
              __shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->_alloter);
    pEVar2 = AlloterWrap::PoolNew<cppnet::Event>(this_00);
    this->_event = pEVar2;
    pEVar2 = this->_event;
    std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this(&local_40);
    std::shared_ptr<cppnet::Socket>::shared_ptr<cppnet::RWSocket,void>
              (&local_30,(shared_ptr<cppnet::RWSocket> *)&local_40);
    Event::SetSocket(pEVar2,&local_30);
    std::shared_ptr<cppnet::Socket>::~shared_ptr(&local_30);
    std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)&local_40);
  }
  bVar1 = Address::IsIpv4((string *)_Stack_18._M_pi);
  if ((this->super_Socket)._sock == 0) {
    SVar4 = OsHandle::TcpSocket(bVar1);
    actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)SVar4._return_value;
    if ((long)actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi < 0) {
      this_01 = Singleton<cppnet::SingletonLogger>::Instance();
      SingletonLogger::Error
                (this_01,
                 "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/rw_socket.cpp"
                 ,0x84,"create socket failed. error:%d",(ulong)(uint)SVar4._errno);
      return;
    }
    (this->super_Socket)._sock =
         (uint64_t)
         actions.super___shared_ptr<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  }
  at = AT_IPV6;
  if (bVar1) {
    at = AT_IPV4;
  }
  Address::SetType(&(this->super_Socket)._addr,at);
  Address::SetIp(&(this->super_Socket)._addr,(string *)_Stack_18._M_pi);
  Address::SetAddrPort(&(this->super_Socket)._addr,local_1a);
  Socket::GetEventActions((Socket *)local_70);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_70);
  if (bVar1) {
    std::atomic<bool>::operator=(&this->_connecting,true);
    std::enable_shared_from_this<cppnet::RWSocket>::shared_from_this(&local_80);
    this_02 = (unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
               *)__connecting_socket_map();
    this_03 = std::
              unordered_map<unsigned_long,_std::shared_ptr<cppnet::Socket>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<cppnet::Socket>_>_>_>
              ::operator[](this_02,&(this->super_Socket)._sock);
    std::shared_ptr<cppnet::Socket>::operator=(this_03,(shared_ptr<cppnet::RWSocket> *)&local_80);
    std::shared_ptr<cppnet::RWSocket>::~shared_ptr((shared_ptr<cppnet::RWSocket> *)&local_80);
    peVar3 = std::
             __shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::EventActions,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_70);
    (*peVar3->_vptr_EventActions[7])(peVar3,this->_event,&(this->super_Socket)._addr);
  }
  std::shared_ptr<cppnet::EventActions>::~shared_ptr((shared_ptr<cppnet::EventActions> *)local_70);
  return;
}

Assistant:

void RWSocket::Connect(const std::string& ip, uint16_t port) {
    if (!_event) {
        _event = _alloter->PoolNew<Event>();
        _event->SetSocket(shared_from_this());
    }

    bool use_ipv4 = false;
    if (Address::IsIpv4(ip)) {
        use_ipv4 = true;
    }
    if (_sock == 0) {
        auto ret = OsHandle::TcpSocket(use_ipv4);
        if (ret._return_value < 0) {
            LOG_ERROR("create socket failed. error:%d", ret._errno);
            return;
        }
        _sock = ret._return_value;
    }

    _addr.SetType(use_ipv4 ? AT_IPV4 : AT_IPV6);
    _addr.SetIp(ip);
    _addr.SetAddrPort(port);

    auto actions = GetEventActions();
    if (actions) {
        _connecting = true;
        __connecting_socket_map[_sock] = shared_from_this();
        actions->AddConnection(_event, _addr);
    }
}